

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  huff_entropy_ptr_conflict entropy_00;
  int *piVar3;
  int iVar4;
  int absvalues [64];
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  uint BR;
  char *BR_buffer;
  int EOB;
  int k;
  int r;
  int temp;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  entropy_00 = (huff_entropy_ptr_conflict)cinfo->entropy;
  entropy_00->next_output_byte = cinfo->dest->next_output_byte;
  entropy_00->free_in_buffer = cinfo->dest->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy_00->restarts_to_go == 0)) {
    emit_restart_e(entropy_00,entropy_00->next_restart_num);
  }
  iVar1 = cinfo->Se;
  iVar2 = cinfo->Al;
  piVar3 = cinfo->natural_order;
  absvalues._248_8_ = *MCU_data;
  BR_buffer._0_4_ = 0;
  for (BR_buffer._4_4_ = cinfo->Ss; BR_buffer._4_4_ <= iVar1; BR_buffer._4_4_ = BR_buffer._4_4_ + 1)
  {
    k = (int)*(short *)(absvalues._248_8_ + (long)piVar3[BR_buffer._4_4_] * 2);
    if (k < 0) {
      k = -k;
    }
    iVar4 = k >> ((byte)iVar2 & 0x1f);
    absvalues[(long)BR_buffer._4_4_ + -2] = iVar4;
    if (iVar4 == 1) {
      BR_buffer._0_4_ = BR_buffer._4_4_;
    }
  }
  EOB = 0;
  Al = 0;
  _Se = entropy_00->bit_buffer + entropy_00->BE;
  for (BR_buffer._4_4_ = cinfo->Ss; BR_buffer._4_4_ <= iVar1; BR_buffer._4_4_ = BR_buffer._4_4_ + 1)
  {
    iVar2 = absvalues[(long)BR_buffer._4_4_ + -2];
    if (iVar2 == 0) {
      EOB = EOB + 1;
    }
    else {
      while (0xf < EOB && BR_buffer._4_4_ <= (int)BR_buffer) {
        emit_eobrun(entropy_00);
        emit_ac_symbol(entropy_00,entropy_00->ac_tbl_no,0xf0);
        EOB = EOB + -0x10;
        emit_buffered_bits(entropy_00,_Se,Al);
        _Se = entropy_00->bit_buffer;
        Al = 0;
      }
      if (iVar2 < 2) {
        emit_eobrun(entropy_00);
        emit_ac_symbol(entropy_00,entropy_00->ac_tbl_no,EOB * 0x10 + 1);
        emit_bits_e(entropy_00,
                    (uint)(-1 < *(short *)(absvalues._248_8_ + (long)piVar3[BR_buffer._4_4_] * 2)),1
                   );
        emit_buffered_bits(entropy_00,_Se,Al);
        _Se = entropy_00->bit_buffer;
        Al = 0;
        EOB = 0;
      }
      else {
        _Se[(uint)Al] = (byte)iVar2 & 1;
        Al = Al + 1;
      }
    }
  }
  if ((0 < EOB) || (Al != 0)) {
    entropy_00->EOBRUN = entropy_00->EOBRUN + 1;
    entropy_00->BE = Al + entropy_00->BE;
    if ((entropy_00->EOBRUN == 0x7fff) || (0x3a9 < entropy_00->BE)) {
      emit_eobrun(entropy_00);
    }
  }
  cinfo->dest->next_output_byte = entropy_00->next_output_byte;
  cinfo->dest->free_in_buffer = entropy_00->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy_00->restarts_to_go == 0) {
      entropy_00->restarts_to_go = cinfo->restart_interval;
      entropy_00->next_restart_num = entropy_00->next_restart_num + 1;
      entropy_00->next_restart_num = entropy_00->next_restart_num & 7;
    }
    entropy_00->restarts_to_go = entropy_00->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);	/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 0);
	  }
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 1);
	  }
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}